

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewFunctionProcessingVisitor.cpp
# Opt level: O0

void __thiscall
NewFunctionProcessingVisitor::Visit
          (NewFunctionProcessingVisitor *this,LogicalExpression *expression)

{
  bool bVar1;
  Value *pVVar2;
  VariableValue *pVVar3;
  PrimitiveSimpleObject *pPVar4;
  Type *pTVar5;
  bool local_13a;
  bool local_139;
  allocator<char> local_c9;
  string local_c8;
  bool local_a5;
  int local_a4;
  int iStack_a0;
  bool result;
  int rhs;
  int lhs;
  int local_78;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  allocator<char> local_71;
  int value;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  allocator<char> local_49;
  string local_48;
  LogicalExpression *local_18;
  LogicalExpression *expression_local;
  NewFunctionProcessingVisitor *this_local;
  
  local_18 = expression;
  expression_local = (LogicalExpression *)this;
  bVar1 = std::operator==(&expression->operation_,"true");
  if (bVar1) {
    pVVar3 = (VariableValue *)operator_new(0x50);
    local_4c = 1;
    pPVar4 = (PrimitiveSimpleObject *)operator_new(0x18);
    local_4b = 1;
    pTVar5 = (Type *)operator_new(0x28);
    local_4a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"boolean",&local_49);
    Type::Type(pTVar5,&local_48);
    local_4a = 0;
    PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar4,pTVar5);
    local_4b = 0;
    VariableValue::VariableValue(pVVar3,pPVar4,1);
    local_4c = 0;
    (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar3;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  else {
    bVar1 = std::operator==(&local_18->operation_,"false");
    if (bVar1) {
      pVVar3 = (VariableValue *)operator_new(0x50);
      local_74 = 1;
      pPVar4 = (PrimitiveSimpleObject *)operator_new(0x18);
      local_73 = 1;
      pTVar5 = (Type *)operator_new(0x28);
      local_72 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&value,"boolean",&local_71);
      Type::Type(pTVar5,(string *)&value);
      local_72 = 0;
      PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar4,pTVar5);
      local_73 = 0;
      VariableValue::VariableValue(pVVar3,pPVar4,0);
      local_74 = 0;
      (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar3;
      std::__cxx11::string::~string((string *)&value);
      std::allocator<char>::~allocator(&local_71);
    }
    else if (local_18->lhs_ == (Expression *)0x0) {
      pVVar2 = TemplateVisitor<Value_*>::Accept
                         (&this->super_TemplateVisitor<Value_*>,&local_18->rhs_->super_Node);
      local_78 = (*pVVar2->_vptr_Value[2])();
      pVVar3 = (VariableValue *)operator_new(0x50);
      rhs._0_1_ = 1;
      pPVar4 = (PrimitiveSimpleObject *)operator_new(0x18);
      rhs._1_1_ = 1;
      pTVar5 = (Type *)operator_new(0x28);
      rhs._2_1_ = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lhs,"boolean",(allocator<char> *)((long)&rhs + 3));
      Type::Type(pTVar5,(string *)&lhs);
      rhs._2_1_ = 0;
      PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar4,pTVar5);
      rhs._1_1_ = 0;
      VariableValue::VariableValue(pVVar3,pPVar4,(uint)(local_78 == 0));
      rhs._0_1_ = 0;
      (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar3;
      std::__cxx11::string::~string((string *)&lhs);
      std::allocator<char>::~allocator((allocator<char> *)((long)&rhs + 3));
    }
    else {
      pVVar2 = TemplateVisitor<Value_*>::Accept
                         (&this->super_TemplateVisitor<Value_*>,&local_18->lhs_->super_Node);
      iStack_a0 = (*pVVar2->_vptr_Value[2])();
      pVVar2 = TemplateVisitor<Value_*>::Accept
                         (&this->super_TemplateVisitor<Value_*>,&local_18->rhs_->super_Node);
      local_a4 = (*pVVar2->_vptr_Value[2])();
      local_a5 = false;
      bVar1 = std::operator==(&local_18->operation_,"&&");
      if (bVar1) {
        local_139 = iStack_a0 != 0 && local_a4 != 0;
        local_a5 = local_139;
      }
      bVar1 = std::operator==(&local_18->operation_,"||");
      if (bVar1) {
        local_13a = iStack_a0 != 0 || local_a4 != 0;
        local_a5 = local_13a;
      }
      bVar1 = std::operator==(&local_18->operation_,"<");
      if (bVar1) {
        local_a5 = iStack_a0 < local_a4;
      }
      bVar1 = std::operator==(&local_18->operation_,"<=");
      if (bVar1) {
        local_a5 = iStack_a0 <= local_a4;
      }
      bVar1 = std::operator==(&local_18->operation_,">");
      if (bVar1) {
        local_a5 = local_a4 < iStack_a0;
      }
      bVar1 = std::operator==(&local_18->operation_,">=");
      if (bVar1) {
        local_a5 = local_a4 <= iStack_a0;
      }
      bVar1 = std::operator==(&local_18->operation_,"==");
      if (bVar1) {
        local_a5 = iStack_a0 == local_a4;
      }
      bVar1 = std::operator==(&local_18->operation_,"!=");
      if (bVar1) {
        local_a5 = iStack_a0 != local_a4;
      }
      pVVar3 = (VariableValue *)operator_new(0x50);
      pPVar4 = (PrimitiveSimpleObject *)operator_new(0x18);
      pTVar5 = (Type *)operator_new(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"boolean",&local_c9);
      Type::Type(pTVar5,&local_c8);
      PrimitiveSimpleObject::PrimitiveSimpleObject(pPVar4,pTVar5);
      VariableValue::VariableValue(pVVar3,pPVar4,local_a5 & 1);
      (this->super_TemplateVisitor<Value_*>).tos_value_ = (Value *)pVVar3;
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
  }
  return;
}

Assistant:

void NewFunctionProcessingVisitor::Visit(LogicalExpression* expression) {
  if (expression->operation_ == "true") {
    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("boolean")), 1);
  } else if (expression->operation_ == "false") {
    tos_value_ =
        new VariableValue(new PrimitiveSimpleObject(new Type("boolean")), 0);
  } else if (expression->lhs_ == nullptr) {
    auto value = Accept(expression->rhs_)->GetValue();
    tos_value_ = new VariableValue(
        new PrimitiveSimpleObject(new Type("boolean")), !value);
  } else {
    auto lhs = Accept(expression->lhs_)->GetValue();
    auto rhs = Accept(expression->rhs_)->GetValue();
    bool result = false;
    if (expression->operation_ == "&&") {
      result = lhs && rhs;
    }
    if (expression->operation_ == "||") {
      result = lhs || rhs;
    }
    if (expression->operation_ == "<") {
      result = lhs < rhs;
    }
    if (expression->operation_ == "<=") {
      result = lhs <= rhs;
    }
    if (expression->operation_ == ">") {
      result = lhs > rhs;
    }
    if (expression->operation_ == ">=") {
      result = lhs >= rhs;
    }
    if (expression->operation_ == "==") {
      result = lhs == rhs;
    }
    if (expression->operation_ == "!=") {
      result = lhs != rhs;
    }

    tos_value_ = new VariableValue(
        new PrimitiveSimpleObject(new Type("boolean")), result);
  }
}